

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

String * kj::getStackTrace(void)

{
  ArrayPtr<void_*const> trace;
  String *in_RCX;
  String *in_RDI;
  ArrayPtr<void_*const> AVar1;
  ArrayPtr<void_*> space_00;
  ArrayPtr<void_*const> trace_00;
  char *in_stack_fffffffffffffeb8;
  Array<char> local_130;
  void *space [32];
  
  space_00.size_ = 2;
  space_00.ptr = (void **)0x20;
  AVar1 = getStackTrace((kj *)space,space_00,(uint)in_RCX);
  trace_00.ptr = (void **)AVar1.size_;
  trace.size_ = (size_t)in_stack_fffffffffffffeb8;
  trace.ptr = (void **)0x18b91d;
  stringifyStackTraceAddresses(trace);
  trace_00.size_ = (size_t)in_RCX;
  stringifyStackTrace((String *)&stack0xfffffffffffffeb8,(kj *)AVar1.ptr,trace_00);
  str<kj::String,kj::String>(in_RDI,(kj *)&local_130,(String *)&stack0xfffffffffffffeb8,in_RCX);
  Array<char>::~Array((Array<char> *)&stack0xfffffffffffffeb8);
  Array<char>::~Array(&local_130);
  return in_RDI;
}

Assistant:

String getStackTrace() {
  void* space[32];
  auto trace = getStackTrace(space, 2);
  return kj::str(stringifyStackTraceAddresses(trace), stringifyStackTrace(trace));
}